

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M680XInstPrinter.c
# Opt level: O3

void M680X_printInst(MCInst *MI,SStream *O,void *PrinterInfo)

{
  cs_m680x_op *op;
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  m680x_reg mVar5;
  m680x_op_rel mVar6;
  cs_detail *pcVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  char *local_38;
  
  pcVar7 = MI->flat_insn->detail;
  uVar11 = *(uint *)((long)PrinterInfo + 0xf8);
  local_38 = ",";
  if ((uVar11 != 0x14e) && (1 < *(byte *)((long)PrinterInfo + 0x15))) {
    lVar10 = 0;
    iVar12 = 0;
    bVar1 = 0;
    do {
      bVar2 = bVar1;
      iVar4 = *(int *)((long)PrinterInfo + lVar10 + 0x18);
      iVar12 = iVar12 + (uint)(iVar4 != 1);
      lVar10 = lVar10 + 0x18;
      bVar1 = bVar2 | iVar4 == 3;
    } while ((ulong)*(byte *)((long)PrinterInfo + 0x15) * 0x18 != lVar10);
    local_38 = ";";
    if (iVar12 == 0) {
      local_38 = ",";
    }
    if (!(bool)(bVar2 | iVar4 == 3)) {
      local_38 = ",";
    }
  }
  if (pcVar7 != (cs_detail *)0x0) {
    memcpy(&pcVar7->field_6,(void *)((long)PrinterInfo + 0x14),0xdc);
    uVar11 = *(uint *)((long)PrinterInfo + 0xf8);
  }
  if ((uVar11 == 0x9f) || (uVar11 == 0)) {
    if (*(char *)((long)PrinterInfo + 0x15) == '\0') {
      SStream_concat(O,"fcb $<unknown>");
      return;
    }
    SStream_concat(O,"fcb $%02X",(ulong)*(uint *)((long)PrinterInfo + 0x1c));
    return;
  }
  pcVar8 = (*MI->csh->insn_name)((csh)MI->csh,uVar11);
  SStream_concat(O,pcVar8);
  SStream_concat(O," ");
  uVar9 = (ulong)*(byte *)((long)PrinterInfo + 0x15);
  if (*(byte *)((long)PrinterInfo + 0x15) != 0) {
    bVar1 = *(byte *)((long)PrinterInfo + 0x14);
    uVar13 = 0;
    do {
      if ((ulong)(bVar1 & 1) + (ulong)((bVar1 >> 1 & 1) != 0) <= uVar13) {
        iVar12 = *(int *)((long)PrinterInfo + uVar13 * 0x18 + 0x18);
        if (iVar12 - 1U < 7) {
          op = (cs_m680x_op *)((long)PrinterInfo + uVar13 * 0x18 + 0x18);
          switch(iVar12) {
          case 1:
            pcVar8 = (*MI->csh->reg_name)((csh)MI->csh,(op->field_1).reg);
            goto LAB_00265ce6;
          case 2:
            mVar6 = (op->field_1).rel;
            uVar9 = (ulong)(uint)mVar6;
            if (MI->csh->imm_unsigned == CS_OPT_OFF) {
              pcVar8 = "#%d";
            }
            else {
              if (op->size == '\x02') {
                uVar9 = (ulong)mVar6.address;
              }
              else if (op->size == '\x01') {
                uVar9 = (ulong)(byte)mVar6.address;
              }
              pcVar8 = "#%u";
            }
            break;
          case 3:
            if (((op->field_1).idx.flags & 1) != 0) {
              SStream_concat(O,"[");
            }
            mVar5 = (op->field_1).idx.offset_reg;
            if (mVar5 == M680X_REG_INVALID) {
              if ((op->field_1).idx.offset_bits == '\0') {
                bVar2 = (op->field_1).idx.inc_dec;
                if ((bVar2 != 0) && (*(int *)((long)PrinterInfo + 0x10) == 9)) {
                  uVar9 = (ulong)(byte)((bVar2 ^ (char)bVar2 >> 7) - ((char)bVar2 >> 7));
                  goto LAB_00265c4a;
                }
              }
              else {
                if ((op->field_1).imm == 0x13) {
                  uVar9 = (ulong)(op->field_1).idx.offset_addr;
                  pcVar8 = "$%04X";
                }
                else {
                  uVar9 = (ulong)(uint)(int)(op->field_1).idx.offset;
LAB_00265c4a:
                  pcVar8 = "%d";
                }
                SStream_concat(O,pcVar8,uVar9);
              }
            }
            else {
              pcVar8 = (*MI->csh->reg_name)((csh)MI->csh,mVar5);
              SStream_concat(O,pcVar8);
            }
            if (((op->field_1).idx.flags & 2) == 0) {
              SStream_concat(O,",");
            }
            printIncDec(false,O,(m680x_info *)PrinterInfo,op);
            pcVar8 = (*MI->csh->reg_name)((csh)MI->csh,(op->field_1).reg);
            SStream_concat(O,pcVar8);
            if (((op->field_1).imm == 0x13) && ((op->field_1).idx.offset_bits != '\0')) {
              SStream_concat(O,"R");
            }
            printIncDec(true,O,(m680x_info *)PrinterInfo,op);
            if (((op->field_1).idx.flags & 1) != 0) {
              pcVar8 = "]";
              goto LAB_00265ce6;
            }
            goto LAB_00265ced;
          case 4:
            uVar3 = (op->field_1).rel.address;
            uVar9 = (ulong)uVar3;
            if (*(byte *)((long)&(op->field_1).reg + 2) == 1) {
              pcVar8 = "[$%04X]";
            }
            else {
              if (0xff < uVar3) goto LAB_00265bb3;
              pcVar8 = ">$%04X";
            }
            break;
          case 5:
            uVar9 = (ulong)(op->field_1).direct_addr;
            pcVar8 = "$%02X";
            break;
          case 6:
            uVar9 = (ulong)(op->field_1).rel.address;
LAB_00265bb3:
            pcVar8 = "$%04X";
            break;
          case 7:
            uVar9 = (ulong)(op->field_1).direct_addr;
            pcVar8 = "%u";
          }
          SStream_concat(O,pcVar8,uVar9);
        }
        else {
          pcVar8 = "<invalid_operand>";
LAB_00265ce6:
          SStream_concat(O,pcVar8);
        }
LAB_00265ced:
        uVar9 = (ulong)*(byte *)((long)PrinterInfo + 0x15);
        if (uVar13 + 1 != uVar9) {
          SStream_concat(O,local_38);
          uVar9 = (ulong)*(byte *)((long)PrinterInfo + 0x15);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar9);
  }
  return;
}

Assistant:

void M680X_printInst(MCInst *MI, SStream *O, void *PrinterInfo)
{
	m680x_info *info = (m680x_info *)PrinterInfo;
	cs_m680x *m680x = &info->m680x;
	cs_detail *detail = MI->flat_insn->detail;
	int suppress_operands = 0;
	const char *delimiter = getDelimiter(info, m680x);
	int i;

	if (detail != NULL)
		memcpy(&detail->m680x, m680x, sizeof(cs_m680x));

	if (info->insn == M680X_INS_INVLD || info->insn == M680X_INS_ILLGL) {
		if (m680x->op_count)
			SStream_concat(O, "fcb $%02X", m680x->operands[0].imm);
		else
			SStream_concat(O, "fcb $<unknown>");

		return;
	}

	printInstructionName(MI->csh, O, info->insn);
	SStream_concat(O, " ");

	if ((m680x->flags & M680X_FIRST_OP_IN_MNEM) != 0)
		suppress_operands++;

	if ((m680x->flags & M680X_SECOND_OP_IN_MNEM) != 0)
		suppress_operands++;

	for (i  = 0; i < m680x->op_count; ++i) {
		if (i >= suppress_operands) {
			printOperand(MI, O, info, &m680x->operands[i]);

			if ((i + 1) != m680x->op_count)
				SStream_concat(O, delimiter);
		}
	}
}